

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O0

void __thiscall deci_FlexLexer::yy_switch_to_buffer(deci_FlexLexer *this,YY_BUFFER_STATE new_buffer)

{
  yy_buffer_state *local_30;
  YY_BUFFER_STATE local_28;
  YY_BUFFER_STATE new_buffer_local;
  deci_FlexLexer *this_local;
  
  yyensure_buffer_stack(this);
  if (this->yy_buffer_stack == (yy_buffer_state **)0x0) {
    local_28 = (YY_BUFFER_STATE)0x0;
  }
  else {
    local_28 = this->yy_buffer_stack[this->yy_buffer_stack_top];
  }
  if (local_28 != new_buffer) {
    if (this->yy_buffer_stack == (yy_buffer_state **)0x0) {
      local_30 = (yy_buffer_state *)0x0;
    }
    else {
      local_30 = this->yy_buffer_stack[this->yy_buffer_stack_top];
    }
    if (local_30 != (yy_buffer_state *)0x0) {
      *this->yy_c_buf_p = this->yy_hold_char;
      this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buf_pos = this->yy_c_buf_p;
      this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_n_chars = this->yy_n_chars;
    }
    this->yy_buffer_stack[this->yy_buffer_stack_top] = new_buffer;
    yy_load_buffer_state(this);
    this->yy_did_buffer_switch_on_eof = 1;
  }
  return;
}

Assistant:

void yyFlexLexer::yy_switch_to_buffer( YY_BUFFER_STATE new_buffer )
{
    
	/* TODO. We should be able to replace this entire function body
	 * with
	 *		yypop_buffer_state();
	 *		yypush_buffer_state(new_buffer);
     */
	yyensure_buffer_stack ();
	if ( YY_CURRENT_BUFFER == new_buffer )
		return;

	if ( YY_CURRENT_BUFFER )
		{
		/* Flush out information for old buffer. */
		*(yy_c_buf_p) = (yy_hold_char);
		YY_CURRENT_BUFFER_LVALUE->yy_buf_pos = (yy_c_buf_p);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	YY_CURRENT_BUFFER_LVALUE = new_buffer;
	yy_load_buffer_state(  );

	/* We don't actually know whether we did this switch during
	 * EOF (yywrap()) processing, but the only time this flag
	 * is looked at is after yywrap() is called, so it's safe
	 * to go ahead and always set it.
	 */
	(yy_did_buffer_switch_on_eof) = 1;
}